

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O3

void __thiscall
OpenMD::ForceMatrixDecomposition::unpackInteractionData
          (ForceMatrixDecomposition *this,InteractionData *idat,int atom1,int atom2)

{
  uint uVar1;
  Snapshot *pSVar2;
  pointer pVVar3;
  pointer pdVar4;
  pointer pVVar5;
  uint i;
  long lVar6;
  uint i_5;
  uint i_8;
  uint i_3;
  
  lVar6 = 0;
  do {
    (this->super_ForceDecomposition).pairwisePot.data_[lVar6] =
         (idat->pot).data_[lVar6] + (this->super_ForceDecomposition).pairwisePot.data_[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  lVar6 = 0;
  do {
    (this->super_ForceDecomposition).excludedPot.data_[lVar6] =
         (idat->excludedPot).data_[lVar6] +
         (this->super_ForceDecomposition).excludedPot.data_[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  lVar6 = 0;
  do {
    (this->super_ForceDecomposition).selectedPot.data_[lVar6] =
         (idat->selePot).data_[lVar6] + (this->super_ForceDecomposition).selectedPot.data_[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 7);
  pSVar2 = (this->super_ForceDecomposition).snap_;
  pVVar3 = (pSVar2->atomData).force.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  lVar6 = 0;
  do {
    pVVar3[atom1].super_Vector<double,_3U>.data_[lVar6] =
         (idat->f1).super_Vector<double,_3U>.data_[lVar6] +
         pVVar3[atom1].super_Vector<double,_3U>.data_[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  lVar6 = 0;
  do {
    pVVar3[atom2].super_Vector<double,_3U>.data_[lVar6] =
         pVVar3[atom2].super_Vector<double,_3U>.data_[lVar6] -
         (idat->f1).super_Vector<double,_3U>.data_[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  if (idat->doParticlePot == true) {
    pdVar4 = (pSVar2->atomData).particlePot.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4[atom1] = idat->vpair * idat->sw + pdVar4[atom1];
    pdVar4[atom2] = idat->vpair * idat->sw + pdVar4[atom2];
  }
  uVar1 = (this->super_ForceDecomposition).atomStorageLayout_;
  if ((uVar1 >> 0x10 & 1) != 0) {
    pdVar4 = (pSVar2->atomData).flucQFrc.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start;
    pdVar4[atom1] = pdVar4[atom1] - idat->dVdFQ1;
    pdVar4[atom2] = pdVar4[atom2] - idat->dVdFQ2;
  }
  if ((uVar1 >> 0xc & 1) != 0) {
    pVVar3 = (pSVar2->atomData).electricField.
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    lVar6 = 0;
    do {
      pVVar3[atom1].super_Vector<double,_3U>.data_[lVar6] =
           (idat->eField1).super_Vector<double,_3U>.data_[lVar6] +
           pVVar3[atom1].super_Vector<double,_3U>.data_[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    lVar6 = 0;
    do {
      pVVar3[atom2].super_Vector<double,_3U>.data_[lVar6] =
           (idat->eField2).super_Vector<double,_3U>.data_[lVar6] +
           pVVar3[atom2].super_Vector<double,_3U>.data_[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
  }
  if ((uVar1 >> 0x11 & 1) != 0) {
    pdVar4 = (pSVar2->atomData).sitePotential.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4[atom1] = idat->sPot1 + pdVar4[atom1];
    pdVar4[atom2] = idat->sPot2 + pdVar4[atom2];
  }
  if ((uVar1 & 0x20) != 0) {
    pVVar5 = (pSVar2->atomData).torque.
             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pVVar3 = pVVar5 + atom1;
    if (pVVar3 != &idat->t1) {
      lVar6 = 0;
      do {
        (pVVar3->super_Vector<double,_3U>).data_[lVar6] =
             (idat->t1).super_Vector<double,_3U>.data_[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
    }
    pVVar5 = pVVar5 + atom2;
    if (pVVar5 != &idat->t2) {
      lVar6 = 0;
      do {
        (pVVar5->super_Vector<double,_3U>).data_[lVar6] =
             (idat->t2).super_Vector<double,_3U>.data_[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 != 3);
    }
  }
  if ((uVar1 >> 0xd & 1) != 0) {
    pdVar4 = (pSVar2->atomData).skippedCharge.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar4[atom1] = idat->skippedCharge1;
    pdVar4[atom2] = idat->skippedCharge2;
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::unpackInteractionData(InteractionData& idat,
                                                       int atom1, int atom2) {
#ifdef IS_MPI
    pot_row[atom1] += 0.5 * idat.pot;
    pot_col[atom2] += 0.5 * idat.pot;
    expot_row[atom1] += 0.5 * idat.excludedPot;
    expot_col[atom2] += 0.5 * idat.excludedPot;
    selepot_row[atom1] += 0.5 * idat.selePot;
    selepot_col[atom2] += 0.5 * idat.selePot;

    atomRowData.force[atom1] += idat.f1;
    atomColData.force[atom2] -= idat.f1;

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      atomRowData.flucQFrc[atom1] -= idat.dVdFQ1;
      atomColData.flucQFrc[atom2] -= idat.dVdFQ2;
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      atomRowData.electricField[atom1] += idat.eField1;
      atomColData.electricField[atom2] += idat.eField2;
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      atomRowData.sitePotential[atom1] += idat.sPot1;
      atomColData.sitePotential[atom2] += idat.sPot2;
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      atomRowData.torque[atom1] = idat.t1;
      atomColData.torque[atom2] = idat.t2;
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      atomRowData.skippedCharge[atom1] = idat.skippedCharge1;
      atomColData.skippedCharge[atom2] = idat.skippedCharge2;
    }

#else
    pairwisePot += idat.pot;
    excludedPot += idat.excludedPot;
    selectedPot += idat.selePot;

    snap_->atomData.force[atom1] += idat.f1;
    snap_->atomData.force[atom2] -= idat.f1;

    if (idat.doParticlePot) {
      // This is the pairwise contribution to the particle pot.  The
      // self and embedding contribution is added in each of the low
      // level non-bonded routines.  In parallel, this calculation is
      // done in collectData, not in unpackInteractionData.
      snap_->atomData.particlePot[atom1] += idat.vpair * idat.sw;
      snap_->atomData.particlePot[atom2] += idat.vpair * idat.sw;
    }

    if (atomStorageLayout_ & DataStorage::dslFlucQForce) {
      snap_->atomData.flucQFrc[atom1] -= idat.dVdFQ1;
      snap_->atomData.flucQFrc[atom2] -= idat.dVdFQ2;
    }

    if (atomStorageLayout_ & DataStorage::dslElectricField) {
      snap_->atomData.electricField[atom1] += idat.eField1;
      snap_->atomData.electricField[atom2] += idat.eField2;
    }

    if (atomStorageLayout_ & DataStorage::dslSitePotential) {
      snap_->atomData.sitePotential[atom1] += idat.sPot1;
      snap_->atomData.sitePotential[atom2] += idat.sPot2;
    }

    if (atomStorageLayout_ & DataStorage::dslTorque) {
      snap_->atomData.torque[atom1] = idat.t1;
      snap_->atomData.torque[atom2] = idat.t2;
    }

    if (atomStorageLayout_ & DataStorage::dslSkippedCharge) {
      snap_->atomData.skippedCharge[atom1] = idat.skippedCharge1;
      snap_->atomData.skippedCharge[atom2] = idat.skippedCharge2;
    }

#endif
  }